

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uint uVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  uv_stream_t *stream;
  uv_loop_t *puVar5;
  int iVar6;
  __pid_t __pid;
  __pid_t _Var7;
  int (*pipes) [2];
  long *plVar8;
  ssize_t sVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int (*fds) [2];
  uv_rwlock_t *rwlock;
  ulong uVar13;
  ulong uVar14;
  int signal_pipe [2];
  int status;
  int exec_errorno;
  undefined8 local_60;
  __pid_t local_54;
  int local_50;
  int local_4c;
  uv_process_t *local_48;
  uv_loop_t *local_40;
  void **local_38;
  
  local_60 = 0xffffffffffffffff;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                  ,0x193,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x1f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                  ,0x198,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  plVar8 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar8;
  *plVar8 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  local_38 = process->queue;
  process->queue[0] = local_38;
  process->queue[1] = local_38;
  uVar14 = 3;
  if (3 < options->stdio_count) {
    uVar14 = (ulong)(uint)options->stdio_count;
  }
  pipes = (int (*) [2])uv__malloc(uVar14 * 8);
  if (pipes == (int (*) [2])0x0) {
    return -0xc;
  }
  local_48 = process;
  local_40 = loop;
  memset(pipes,0xff,uVar14 * 8);
  if (0 < options->stdio_count) {
    lVar11 = 8;
    lVar12 = 0;
    fds = pipes;
    do {
      puVar3 = options->stdio;
      uVar2 = *(uint *)((long)puVar3 + lVar11 + -8);
      switch(uVar2 & 7) {
      case 0:
        break;
      case 1:
        lVar4 = *(long *)((long)&puVar3->flags + lVar11);
        if (lVar4 == 0) {
          __assert_fail("container->data.stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                        ,199,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (*(int *)(lVar4 + 0x10) != 7) {
LAB_00157e8a:
          iVar6 = -0x16;
          goto LAB_00157ebb;
        }
        iVar6 = uv__make_socketpair(*fds,0);
        if (iVar6 != 0) goto LAB_00157ebb;
        break;
      case 2:
      case 4:
        plVar8 = (long *)((long)&puVar3->flags + lVar11);
        if ((uVar2 & 2) == 0) {
          plVar8 = (long *)(*plVar8 + 0xb8);
        }
        if ((int)*plVar8 == -1) goto LAB_00157e8a;
        (*fds)[1] = (int)*plVar8;
        break;
      default:
        __assert_fail("0 && \"Unexpected flags\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                      ,0xdb,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      lVar12 = lVar12 + 1;
      fds = fds + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 < options->stdio_count);
  }
  iVar6 = uv__make_pipe((int *)&local_60,0);
  puVar5 = local_40;
  if (iVar6 == 0) {
    uv_signal_start(&local_40->child_watcher,uv__chld,0x11);
    rwlock = &puVar5->cloexec_lock;
    uv_rwlock_wrlock(rwlock);
    __pid = fork();
    if (__pid != -1) {
      if (__pid == 0) {
        uv__process_child_init(options,(int)uVar14,pipes,local_60._4_4_);
        goto LAB_0015812d;
      }
      uv_rwlock_wrunlock(rwlock);
      uv__close(local_60._4_4_);
      local_48->status = 0;
      local_4c = 0;
      do {
        sVar9 = read((int)local_60,&local_4c,4);
        if (sVar9 != -1) {
          if (sVar9 == 0) goto LAB_00157f53;
          if (sVar9 != 4) goto LAB_00158099;
          goto LAB_00157f2c;
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      if (*piVar10 != 0x20) {
LAB_00158099:
        abort();
      }
      do {
        _Var7 = waitpid(__pid,&local_50,0);
        if (_Var7 != -1) break;
      } while (*piVar10 == 4);
      if (_Var7 != __pid) {
        __assert_fail("err == pid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                      ,0x1f1,
                      "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
      }
      goto LAB_00157f53;
    }
    piVar10 = __errno_location();
    iVar6 = -*piVar10;
    uv_rwlock_wrunlock(rwlock);
    uv__close((int)local_60);
    uv__close(local_60._4_4_);
  }
LAB_00157ebb:
  uVar13 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar13) ||
       ((options->stdio[uVar13].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar13][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar13][0]);
      }
      if (pipes[uVar13][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar13][1]);
      }
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != uVar14);
LAB_00157efe:
  uv__free(pipes);
  return iVar6;
  while (piVar10 = __errno_location(), *piVar10 == 4) {
LAB_00157f2c:
    _Var7 = waitpid(__pid,&local_50,0);
    if (_Var7 != -1) break;
  }
  if (_Var7 != __pid) {
LAB_0015812d:
    __assert_fail("err == pid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/process.c"
                  ,0x1ec,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
LAB_00157f53:
  local_54 = __pid;
  uv__close_nocheckstdio((int)local_60);
  puVar5 = local_40;
  iVar6 = options->stdio_count;
  if (0 < iVar6) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      puVar3 = options->stdio;
      if (((*(byte *)((long)&puVar3->flags + lVar11) & 1) != 0) && (-1 < pipes[lVar12][0])) {
        iVar6 = uv__close(pipes[lVar12][1]);
        if (iVar6 != 0) goto LAB_00158099;
        pipes[lVar12][1] = -1;
        uv__nonblock_ioctl(pipes[lVar12][0],1);
        stream = *(uv_stream_t **)((long)&puVar3->data + lVar11);
        if ((stream->type != UV_NAMED_PIPE) || (iVar6 = 0x60, *(int *)&stream[1].data == 0)) {
          iVar6 = (uint)(lVar11 == 0) * 0x20 + 0x20;
        }
        iVar6 = uv__stream_open(stream,pipes[lVar12][0],iVar6);
        if (iVar6 != 0) goto joined_r0x0015806e;
        iVar6 = options->stdio_count;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 < iVar6);
  }
  if (local_4c == 0) {
    local_48->queue[0] = puVar5->process_handles;
    plVar8 = (long *)puVar5->process_handles[1];
    local_48->queue[1] = plVar8;
    *plVar8 = (long)local_38;
    puVar5->process_handles[1] = local_38;
    uVar2 = local_48->flags;
    if (((uVar2 >> 0xe & 1) == 0) && (local_48->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)) {
      puVar1 = &local_48->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  local_48->pid = local_54;
  local_48->exit_cb = options->exit_cb;
  iVar6 = local_4c;
  goto LAB_00157efe;
joined_r0x0015806e:
  for (; lVar11 != 0; lVar11 = lVar11 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar11) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar11 + -8));
    }
  }
  goto LAB_00157ebb;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = UV__ERR(errno);
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}